

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materialized_query_result.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
__thiscall duckdb::MaterializedQueryResult::TakeCollection(MaterializedQueryResult *this)

{
  InvalidInputException *this_00;
  InternalException *this_01;
  long in_RSI;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*(char *)(in_RSI + 200) == '\0') {
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "Attempting to get collection from an unsuccessful query result\n: Error %s","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,*(long *)(in_RSI + 0xf8),
               *(long *)(in_RSI + 0x100) + *(long *)(in_RSI + 0xf8));
    InvalidInputException::InvalidInputException<std::__cxx11::string>(this_00,&local_68,&local_48);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(_func_int ***)(in_RSI + 0x188) != (_func_int **)0x0) {
    (this->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult =
         *(_func_int ***)(in_RSI + 0x188);
    *(undefined8 *)(in_RSI + 0x188) = 0;
    return (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            )(unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
              )this;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Missing collection from materialized query result","");
  InternalException::InternalException(this_01,&local_68);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ColumnDataCollection> MaterializedQueryResult::TakeCollection() {
	if (HasError()) {
		throw InvalidInputException("Attempting to get collection from an unsuccessful query result\n: Error %s",
		                            GetError());
	}
	if (!collection) {
		throw InternalException("Missing collection from materialized query result");
	}
	return std::move(collection);
}